

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Tag.cpp
# Opt level: O0

void __thiscall psy::C::TagType::TagType(TagType *this,TagTypeKind tagTyK,Identifier *tag)

{
  TagTypeImpl *this_00;
  pointer pTVar1;
  Identifier *tag_local;
  TagTypeKind tagTyK_local;
  TagType *this_local;
  
  this_00 = (TagTypeImpl *)operator_new(0x18);
  TagTypeImpl::TagTypeImpl(this_00,tagTyK,tag);
  Type::Type(&this->super_Type,(TypeImpl *)this_00);
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__TagType_00735c40;
  pTVar1 = std::unique_ptr<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>::
           operator->(&(this->super_Type).impl_);
  *(ushort *)&pTVar1->field_0 = *(ushort *)&pTVar1->field_0 & 0xe7ff | (tagTyK & 3) << 0xb;
  return;
}

Assistant:

TagType::TagType(TagTypeKind tagTyK, const Identifier* tag)
    : Type(new TagTypeImpl(tagTyK, tag))
{
    P->F_.tagTyK_ = static_cast<std::uint32_t>(tagTyK);
}